

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

treeNode * stmtSequence(void)

{
  bool bVar1;
  treeNode *ptVar2;
  treeNode *ptVar3;
  treeNode *ptVar4;
  treeNode *ptVar5;
  allocator local_51;
  string local_50;
  
  ptVar3 = (treeNode *)0x0;
  ptVar5 = (treeNode *)0x0;
  while( true ) {
    if (nextToken.kind == Eof) {
      return ptVar5;
    }
    bVar1 = std::operator!=(&nextToken.text,"}");
    if (!bVar1) break;
    ptVar2 = statement();
    if (ptVar2 != (treeNode *)0x0) {
      ptVar4 = ptVar2;
      if (ptVar3 != (treeNode *)0x0) {
        ptVar3->sibling = ptVar2;
        ptVar4 = ptVar5;
      }
      ptVar3 = ptVar2;
      ptVar5 = ptVar4;
      if (((ptVar2->kind).stmtKind < (breakStmt|ifStmt)) &&
         ((0x7e4U >> ((ptVar2->kind).stmtKind & 0x1f) & 1) != 0)) {
        std::__cxx11::string::string((string *)&local_50,";",&local_51);
        match(&local_50,lackSem);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  return ptVar5;
}

Assistant:

treeNode* stmtSequence()
{
    treeNode* ret=nullptr;
    treeNode* p=nullptr;
    treeNode* pre=nullptr;
    while(nextToken.kind!=Token::Eof&&nextToken.text!="}")
    {
        p=statement();
        if(p!=nullptr)
        {
            if(pre!=nullptr)pre->sibling=p;else ret=p;
            pre=p;
            switch(pre->kind.stmtKind)
            {
                case StmtKind::assignStmt:
                case StmtKind::breakStmt:
                case StmtKind::continueStmt:
                case StmtKind::doRpt:
                case StmtKind::printStmt:
                case StmtKind::readStmt:
                case StmtKind::declareStmt:
                    match(";",Error::lackSem);
                    break;
            }
        }
    }
    //match(";",Error::lackSem);
    return ret;
}